

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_Dsd6DecomposeTripleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  char (*pacVar1) [32];
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  uint jVar;
  uint nVars_00;
  uint uVar6;
  size_t sVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  char (*pacVar15) [32];
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  char *pcVar23;
  word *pwVar24;
  ulong uVar25;
  word tCof0;
  word tCof1;
  timespec ts;
  long local_d90;
  word local_d50;
  char (*local_d48) [8];
  long local_d40;
  ulong local_d38;
  word local_d30;
  Dau_Dsd_t local_d28;
  ulong uVar7;
  
  uVar25 = (ulong)(uint)nVars;
  iVar5 = clock_gettime(3,(timespec *)&local_d28);
  if (iVar5 < 0) {
    local_d90 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_d28.nSizeNonDec,local_d28.nPos)),8);
    local_d90 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_d28._0_8_ * -1000000;
  }
  pacVar1 = p->Cache;
  local_d48 = p->pVarDefs;
  do {
    uVar6 = (uint)uVar25;
    uVar17 = uVar25;
    if (0 < (int)uVar6) {
      jVar = uVar6 - 1;
      uVar7 = (ulong)jVar;
      nVars_00 = uVar6 - 2;
      local_d40 = (long)(int)nVars_00;
      uVar16 = uVar25;
      do {
        if (6 < uVar16) {
LAB_0051170b:
          __assert_fail("iVar >= 0 && iVar < 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x337,"word Abc_Tt6Cofactor0(word, int)");
        }
        uVar17 = uVar16 - 1;
        pwVar24 = s_Truths6Neg;
        uVar22 = s_Truths6Neg[uVar17];
        uVar18 = uVar22 & *pTruth;
        bVar9 = (byte)(1 << ((byte)uVar17 & 0x1f));
        uVar18 = uVar18 << (bVar9 & 0x3f) | uVar18;
        uVar13 = *pTruth & s_Truths6[uVar17];
        uVar13 = uVar13 >> (bVar9 & 0x3f) | uVar13;
        uVar14 = 0;
        uVar21 = 0;
        do {
          if (uVar17 != uVar14) {
            if (((p == (Dau_Dsd_t *)0x0) ||
                (iVar5 = (int)pacVar1[pVars[uVar17]][pVars[uVar14]],
                pacVar1[pVars[uVar17]][pVars[uVar14]] == '\0')) &&
               (bVar10 = (byte)(1 << ((byte)uVar14 & 0x1f)),
               iVar5 = (uint)((*pwVar24 & (uVar18 >> (bVar10 & 0x3f) ^ uVar18)) != 0) +
                       (uint)((*pwVar24 & (uVar13 >> (bVar10 & 0x3f) ^ uVar13)) != 0) * 2,
               p != (Dau_Dsd_t *)0x0)) {
              iVar2 = pVars[uVar17];
              iVar3 = pVars[uVar14];
              if (iVar2 == iVar3) {
                __assert_fail("v != u",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                              ,0x459,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
              }
              if (2 < iVar5 - 1U) {
                __assert_fail("Status > 0 && Status < 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                              ,0x45a,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
              }
              if (pacVar1[iVar2][iVar3] != '\0') {
                __assert_fail("p->Cache[v][u] == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                              ,0x45b,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
              }
              pacVar1[iVar2][iVar3] = (char)iVar5;
            }
            uVar21 = uVar21 | iVar5 << ((byte)uVar14 * '\x02' & 0x1f);
          }
          uVar14 = uVar14 + 1;
          pwVar24 = pwVar24 + 1;
        } while (uVar25 != uVar14);
        if ((uVar21 & 0x55555555 & uVar21 >> 1) == 0) {
          local_d28.fSplitPrime = 0;
          local_d28.fWriteTruth = p->fWriteTruth;
          iVar5 = pVars[uVar17];
          pVars[uVar17] = pVars[uVar7];
          pVars[uVar7] = iVar5;
          Abc_TtSwapVars(pTruth,uVar6,(int)uVar17,jVar);
          if (6 < uVar6) goto LAB_0051170b;
          local_d50 = s_Truths6Neg[uVar7] & *pTruth;
          bVar9 = (byte)(1 << ((byte)jVar & 0x1f));
          local_d50 = local_d50 << (bVar9 & 0x3f) | local_d50;
          local_d30 = *pTruth & s_Truths6[uVar7];
          local_d30 = local_d30 >> (bVar9 & 0x3f) | local_d30;
          iVar5 = p->nPos;
          p->nPos = iVar5 + 1;
          p->pOutput[iVar5] = '<';
          Dau_DsdWriteVar(p,pVars[uVar7],0);
          Dau_DsdDecomposeInt(&local_d28,&local_d30,jVar);
          if (local_d28.pOutput[0] != 0) {
            pcVar23 = local_d28.pOutput;
            bVar9 = local_d28.pOutput[0];
            do {
              pcVar23 = pcVar23 + 1;
              if (((char)bVar9 < 'a') || ((int)(uVar6 | 0x60) <= (int)(uint)bVar9)) {
                iVar5 = p->nPos;
                p->nPos = iVar5 + 1;
                p->pOutput[iVar5] = bVar9;
              }
              else {
                Dau_DsdWriteVar(p,pVars[(ulong)bVar9 - 0x61],0);
              }
              bVar9 = *pcVar23;
            } while (bVar9 != 0);
          }
          p->nSizeNonDec = local_d28.nSizeNonDec;
          if (local_d28.nSizeNonDec != 0) {
            *pTruth = local_d30;
          }
          Dau_DsdDecomposeInt(&local_d28,&local_d50,jVar);
          if (local_d28.pOutput[0] != 0) {
            pcVar23 = local_d28.pOutput;
            do {
              pcVar23 = pcVar23 + 1;
              if ((local_d28.pOutput[0] < 'a') ||
                 ((int)(uVar6 | 0x60) <= (int)(uint)(byte)local_d28.pOutput[0])) {
                iVar5 = p->nPos;
                p->nPos = iVar5 + 1;
                p->pOutput[iVar5] = local_d28.pOutput[0];
              }
              else {
                Dau_DsdWriteVar(p,pVars[(ulong)(byte)local_d28.pOutput[0] - 0x61],0);
              }
              local_d28.pOutput[0] = *pcVar23;
            } while (local_d28.pOutput[0] != 0);
          }
          iVar5 = p->nPos;
          p->nPos = iVar5 + 1;
          p->pOutput[iVar5] = '>';
          iVar5 = p->nSizeNonDec;
          if (p->nSizeNonDec <= local_d28.nSizeNonDec) {
            iVar5 = local_d28.nSizeNonDec;
          }
          p->nSizeNonDec = iVar5;
          if (local_d28.nSizeNonDec != 0) {
            *pTruth = local_d50;
          }
LAB_005115c8:
          uVar25 = 0;
          goto LAB_005115cb;
        }
        uVar20 = uVar21 & 0x55555555 & ~uVar21 >> 1;
        if ((uVar20 - 1 < (uVar20 ^ uVar20 - 1)) &&
           (uVar21 = ~uVar21 & uVar21 >> 1 & 0x55555555, uVar21 - 1 < (uVar21 ^ uVar21 - 1))) {
          if (uVar20 == 0) {
LAB_0051172a:
            __assert_fail("Supp > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0x567,"int Abc_TtSuppFindFirst(int)");
          }
          uVar11 = 0;
          do {
            if ((uVar20 >> (uVar11 & 0x1f) & 1) != 0) goto LAB_005110cd;
            uVar11 = uVar11 + 1;
          } while (uVar11 != 0x20);
          uVar11 = 0xffffffff;
LAB_005110cd:
          if (uVar21 == 0) goto LAB_0051172a;
          uVar11 = (int)uVar11 >> 1;
          uVar20 = 0;
          do {
            if ((uVar21 >> (uVar20 & 0x1f) & 1) != 0) goto LAB_005110f0;
            uVar20 = uVar20 + 1;
          } while (uVar20 != 0x20);
          uVar20 = 0xffffffff;
LAB_005110f0:
          uVar13 = s_Truths6[uVar17];
          uVar14 = uVar13 & *pTruth;
          if ((5 < uVar11) || (uVar20 = (int)uVar20 >> 1, local_d38 = uVar13, 5 < uVar20))
          goto LAB_0051170b;
          uVar14 = uVar14 >> (bVar9 & 0x3f) | uVar14;
          uVar22 = *pTruth & uVar22;
          uVar22 = uVar22 << (bVar9 & 0x3f) | uVar22;
          uVar18 = s_Truths6[uVar11] & uVar22;
          bVar9 = (byte)(1 << ((byte)uVar11 & 0x1f));
          uVar22 = uVar22 & s_Truths6Neg[uVar11];
          uVar19 = s_Truths6Neg[uVar20] & uVar14;
          bVar10 = (byte)(1 << ((byte)uVar20 & 0x1f));
          uVar18 = uVar18 >> (bVar9 & 0x3f) | uVar18;
          uVar14 = uVar14 & s_Truths6[uVar20];
          uVar22 = uVar22 << (bVar9 & 0x3f) | uVar22;
          uVar19 = uVar19 << (bVar10 & 0x3f) | uVar19;
          uVar14 = uVar14 >> (bVar10 & 0x3f) | uVar14;
          if ((uVar18 == uVar14 && uVar22 == uVar19) || (uVar18 == uVar19 && uVar22 == uVar14)) {
            iVar5 = pVars[uVar11];
            *pTruth = (uVar14 ^ uVar19) & uVar13 ^ uVar19;
            pcVar23 = "";
            if (uVar18 == uVar19 && uVar22 == uVar14) {
              pcVar23 = "!";
            }
            sprintf((char *)&local_d28,"<%c%c%s%c>",(ulong)(pVars[uVar17] + 0x61),
                    (ulong)(pVars[uVar20] + 0x61),pcVar23,(ulong)(iVar5 + 0x61));
            sVar8 = strlen((char *)&local_d28);
            if (7 < sVar8) {
              __assert_fail("strlen(pStr) < 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
            }
            uVar21 = p->nVarsUsed;
            uVar22 = (ulong)(int)uVar21;
            if (0x1f < (long)uVar22) {
              __assert_fail("p->nVarsUsed < 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
            }
            uVar13 = uVar22;
            if (0 < (int)uVar21) {
              lVar12 = 0;
              do {
                pacVar1[(int)uVar22][lVar12] = '\0';
                lVar12 = lVar12 + 1;
                uVar21 = p->nVarsUsed;
                uVar22 = (ulong)uVar21;
              } while (lVar12 < (int)uVar21);
              uVar13 = (long)(int)uVar21;
              if (0 < (int)uVar21) {
                lVar12 = 0;
                pacVar15 = pacVar1;
                do {
                  (*pacVar15)[(int)uVar22] = '\0';
                  lVar12 = lVar12 + 1;
                  uVar21 = p->nVarsUsed;
                  uVar22 = (ulong)uVar21;
                  uVar13 = (ulong)(int)uVar21;
                  pacVar15 = pacVar15 + 1;
                } while (lVar12 < (long)uVar13);
              }
            }
            p->nVarsUsed = uVar21 + 1;
            strcpy(local_d48[uVar13],(char *)&local_d28);
            pVars[uVar17] = p->nVarsUsed + -1;
            iVar2 = pVars[uVar20];
            pVars[uVar20] = pVars[uVar7];
            pVars[uVar7] = iVar2;
            Abc_TtSwapVars(pTruth,uVar6,uVar20,jVar);
            if (uVar6 == 1) {
LAB_0051168f:
              __assert_fail("v < nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x454,"int Dau_DsdFindVarDef(int *, int, int)");
            }
            lVar12 = 0;
            uVar22 = 0;
            while (pVars[uVar22] != iVar5) {
              uVar22 = uVar22 + 1;
              lVar12 = lVar12 + 0x100000000;
              if (uVar7 == uVar22) goto LAB_0051168f;
            }
            iVar5 = *(int *)((long)pVars + (lVar12 >> 0x1e));
            *(int *)((long)pVars + (lVar12 >> 0x1e)) = pVars[local_d40];
            pVars[local_d40] = iVar5;
            Abc_TtSwapVars(pTruth,jVar,(int)uVar22,(int)local_d40);
            if (uVar6 == 2) goto LAB_0051168f;
            uVar22 = 0;
            while (pVars[uVar22] != p->nVarsUsed + -1) {
              uVar22 = uVar22 + 1;
              if (nVars_00 == uVar22) goto LAB_0051168f;
            }
            iVar5 = Dau_Dsd6DecomposeSingleVarOne(p,pTruth,pVars,nVars_00,(int)uVar22);
            uVar21 = nVars_00;
            if ((iVar5 == 0) ||
               (uVar21 = Dau_Dsd6DecomposeSingleVar(p,pTruth,pVars,uVar6 - 3), uVar21 != uVar6)) {
              if ((uVar21 == 0) ||
                 (uVar6 = Dau_Dsd6DecomposeDoubleVars(p,pTruth,pVars,uVar21), uVar6 == 0)) {
                iVar5 = clock_gettime(3,(timespec *)&local_d28);
                if (iVar5 < 0) {
                  lVar12 = -1;
                }
                else {
                  lVar12 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 +
                           local_d28._0_8_ * 1000000;
                }
                s_Times_2 = s_Times_2 + lVar12 + local_d90;
                goto LAB_005115c8;
              }
              uVar25 = (ulong)uVar6;
              uVar17 = uVar16;
              break;
            }
          }
        }
        bVar4 = 1 < (long)uVar16;
        uVar16 = uVar17;
      } while (bVar4);
    }
    if ((int)uVar17 == 0) {
      iVar5 = clock_gettime(3,(timespec *)&local_d28);
      if (iVar5 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 + local_d28._0_8_ * 1000000;
      }
      s_Times_2 = s_Times_2 + lVar12 + local_d90;
LAB_005115cb:
      return (int)uVar25;
    }
  } while( true );
}

Assistant:

int Dau_Dsd6DecomposeTripleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v;
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
        for ( v = nVars - 1; v >= 0; v-- )
        {
            unsigned uSupports = Dau_Dsd6FindSupports( p, pTruth, pVars, nVars, v );
//            Dau_DsdPrintSupports( uSupports, nVars );
            if ( (uSupports & (uSupports >> 1) & 0x55555555) == 0 ) // non-overlapping supports
                return Dau_Dsd6DecomposeTripleVarsOuter( p, pTruth, pVars, nVars, v );
            if ( Abc_TtSuppOnlyOne( uSupports & (~uSupports >> 1) & 0x55555555) &&
                 Abc_TtSuppOnlyOne(~uSupports & ( uSupports >> 1) & 0x55555555) ) // one unique variable in each cofactor
            {
                int nVarsNew = Dau_Dsd6DecomposeTripleVarsInner( p, pTruth, pVars, nVars, v, uSupports );
                if ( nVarsNew == nVars )
                    continue;
                if ( nVarsNew == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                nVars = Dau_Dsd6DecomposeDoubleVars( p, pTruth, pVars, nVarsNew );
                if ( nVars == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                break;
            }
        }
        if ( v == -1 )
        {
            s_Times[2] += Abc_Clock() - clk;
            return nVars;
        }
    }
    assert( 0 );
    return -1;
}